

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

UBool __thiscall
icu_63::AnnualTimeZoneRule::getStartInYear
          (AnnualTimeZoneRule *this,int32_t year,int32_t prevRawOffset,int32_t prevDSTSavings,
          UDate *result)

{
  DateTimeRule *this_00;
  bool bVar1;
  DateRuleType DVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  TimeRuleType TVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  double local_38;
  
  if (year < this->fStartYear) {
    return '\0';
  }
  if (this->fEndYear < year) {
    return '\0';
  }
  DVar2 = DateTimeRule::getDateRuleType(this->fDateTimeRule);
  this_00 = this->fDateTimeRule;
  if (DVar2 == DOW) {
    iVar3 = DateTimeRule::getRuleWeekInMonth(this_00);
    iVar4 = DateTimeRule::getRuleMonth(this->fDateTimeRule);
    if (iVar3 < 1) {
      iVar5 = DateTimeRule::getRuleMonth(this->fDateTimeRule);
      iVar9 = 0;
      if ((year & 3U) == 0) {
        uVar8 = year * -0x3d70a3d7 + 0x51eb850;
        iVar9 = 0xc;
        if ((uVar8 >> 2 | year * 0x40000000) < 0x28f5c29) {
          iVar9 = 0xc;
          if (0xa3d70a < (uVar8 >> 4 | year * -0x70000000)) {
            iVar9 = 0;
          }
        }
      }
      local_38 = Grego::fieldsToDay(year,iVar4,(int)(char)Grego::MONTH_LENGTH[iVar9 + iVar5]);
      local_38 = (double)(iVar3 * 7 + 7) + local_38;
      bVar11 = true;
    }
    else {
      local_38 = Grego::fieldsToDay(year,iVar4,1);
      local_38 = (double)(iVar3 * 7 + -7) + local_38;
      bVar11 = false;
    }
  }
  else {
    if (DVar2 == DOM) {
      iVar3 = DateTimeRule::getRuleMonth(this_00);
      iVar4 = DateTimeRule::getRuleDayOfMonth(this->fDateTimeRule);
      local_38 = Grego::fieldsToDay(year,iVar3,iVar4);
      goto LAB_0020763d;
    }
    iVar3 = DateTimeRule::getRuleMonth(this_00);
    iVar4 = DateTimeRule::getRuleDayOfMonth(this->fDateTimeRule);
    bVar11 = DVar2 == DOW_LEQ_DOM;
    if (((bVar11) && (iVar4 == 0x1d && iVar3 == 1)) && (iVar4 = 0x1c, (year & 3U) == 0)) {
      uVar8 = year * -0x3d70a3d7 + 0x51eb850;
      iVar4 = 0x1d;
      if ((uVar8 >> 2 | year * 0x40000000) < 0x28f5c29) {
        iVar4 = ((uVar8 >> 4 | year * -0x70000000) < 0xa3d70b) + 0x1c;
      }
    }
    local_38 = Grego::fieldsToDay(year,iVar3,iVar4);
  }
  iVar3 = Grego::dayOfWeek(local_38);
  iVar4 = DateTimeRule::getRuleDayOfWeek(this->fDateTimeRule);
  iVar6 = iVar4 - iVar3;
  bVar1 = iVar6 < 0;
  iVar9 = 7;
  if (bVar11) {
    bVar1 = 0 < iVar6;
    iVar9 = -7;
  }
  iVar10 = 0;
  if (bVar1) {
    iVar10 = iVar9;
  }
  local_38 = (double)(iVar10 + iVar6) + local_38;
LAB_0020763d:
  iVar3 = DateTimeRule::getRuleMillisInDay(this->fDateTimeRule);
  *result = local_38 * 86400000.0 + (double)iVar3;
  TVar7 = DateTimeRule::getTimeRuleType(this->fDateTimeRule);
  if (TVar7 != UTC_TIME) {
    *result = *result - (double)prevRawOffset;
  }
  TVar7 = DateTimeRule::getTimeRuleType(this->fDateTimeRule);
  if (TVar7 == WALL_TIME) {
    *result = *result - (double)prevDSTSavings;
  }
  return '\x01';
}

Assistant:

UBool
AnnualTimeZoneRule::getStartInYear(int32_t year,
                                   int32_t prevRawOffset,
                                   int32_t prevDSTSavings,
                                   UDate &result) const {
    if (year < fStartYear || year > fEndYear) {
        return FALSE;
    }
    double ruleDay;
    DateTimeRule::DateRuleType type = fDateTimeRule->getDateRuleType();
    if (type == DateTimeRule::DOM) {
        ruleDay = Grego::fieldsToDay(year, fDateTimeRule->getRuleMonth(), fDateTimeRule->getRuleDayOfMonth());
    } else {
        UBool after = TRUE;
        if (type == DateTimeRule::DOW) {
            // Normalize DOW rule into DOW_GEQ_DOM or DOW_LEQ_DOM
            int32_t weeks = fDateTimeRule->getRuleWeekInMonth();
            if (weeks > 0) {
                ruleDay = Grego::fieldsToDay(year, fDateTimeRule->getRuleMonth(), 1);
                ruleDay += 7 * (weeks - 1);
            } else {
                after = FALSE;
                ruleDay = Grego::fieldsToDay(year, fDateTimeRule->getRuleMonth(),
                    Grego::monthLength(year, fDateTimeRule->getRuleMonth()));
                ruleDay += 7 * (weeks + 1);
           }
        } else {
            int32_t month = fDateTimeRule->getRuleMonth();
            int32_t dom = fDateTimeRule->getRuleDayOfMonth();
            if (type == DateTimeRule::DOW_LEQ_DOM) {
                after = FALSE;
                // Handle Feb <=29
                if (month == UCAL_FEBRUARY && dom == 29 && !Grego::isLeapYear(year)) {
                    dom--;
                }
            }
            ruleDay = Grego::fieldsToDay(year, month, dom);
        }
        int32_t dow = Grego::dayOfWeek(ruleDay);
        int32_t delta = fDateTimeRule->getRuleDayOfWeek() - dow;
        if (after) {
            delta = delta < 0 ? delta + 7 : delta;
        } else {
            delta = delta > 0 ? delta - 7 : delta;
        }
        ruleDay += delta;
    }

    result = ruleDay*U_MILLIS_PER_DAY + fDateTimeRule->getRuleMillisInDay();
    if (fDateTimeRule->getTimeRuleType() != DateTimeRule::UTC_TIME) {
        result -= prevRawOffset;
    }
    if (fDateTimeRule->getTimeRuleType() == DateTimeRule::WALL_TIME) {
        result -= prevDSTSavings;
    }
    return TRUE;
}